

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O2

string * __thiscall
banksia::formatPeriod_abi_cxx11_(string *__return_storage_ptr__,banksia *this,int seconds)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  ostringstream stringStream;
  
  uVar6 = (int)this >> 0x1f;
  uVar1 = (ulong)uVar6 << 0x20 | (ulong)this & 0xffffffff;
  uVar2 = (long)uVar1 / 0x3c;
  uVar3 = (long)((ulong)uVar6 << 0x20 | (ulong)this & 0xffffffff) / 0xe10;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stringStream);
  if (0x1517f < (int)this) {
    poVar4 = (ostream *)
             std::ostream::operator<<(&stringStream,(int)(((ulong)this & 0xffffffff) / 0x15180));
    std::operator<<(poVar4,"d ");
  }
  iVar7 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) % 0x18);
  if (0 < iVar7) {
    poVar4 = (ostream *)std::ostream::operator<<(&stringStream,iVar7);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = std::operator<<(poVar4,0x30);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
  }
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (&stringStream,
                      (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                           0x3c));
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = std::operator<<(poVar4,0x30);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
  uVar5 = std::ostream::operator<<(poVar4,(int)((long)uVar1 % 0x3c));
  poVar4 = std::operator<<(uVar5,0x20);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stringStream);
  return __return_storage_ptr__;
}

Assistant:

std::string formatPeriod(int seconds)
    {
        int s = seconds % 60, minutes = seconds / 60, m = minutes % 60, hours = minutes / 60, h = hours % 24, d = hours / 24;
        
        std::ostringstream stringStream;
        if (d > 0) {
            stringStream << d << "d ";
        }
        if (h > 0) {
            stringStream << h << ":"
            << std::setfill('0') << std::setw(2);
        }
        
        stringStream
        << m << ":"
        << std::setfill('0') << std::setw(2)
        << s
        << std::setfill(' ') << std::setw(0);
        return stringStream.str();
    }